

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_address.cpp
# Opt level: O2

int CfdGetAddressFromLockingScript
              (void *handle,char *locking_script,int network_type,char **address)

{
  bool bVar1;
  NetType type;
  char *pcVar2;
  CfdException *pCVar3;
  bool is_bitcoin;
  AddressFactory address_factory;
  Script script;
  Address addr;
  Address local_1a0;
  
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(locking_script);
  if (bVar1) {
    addr._0_8_ = (long)
                 "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
                 + 0x56;
    addr.witness_ver_ = 0x403;
    addr.address_._M_dataplus._M_p = "CfdGetAddressFromLockingScript";
    cfd::core::logger::warn<>((CfdSourceLocation *)&addr,"lockingScript is null or empty.");
    pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string
              ((string *)&addr,"Failed to parameter. lockingScript is null or empty.",
               (allocator *)&local_1a0);
    cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&addr);
    __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  if (address != (char **)0x0) {
    is_bitcoin = false;
    type = cfd::capi::ConvertNetType(network_type,&is_bitcoin);
    std::__cxx11::string::string((string *)&addr,locking_script,(allocator *)&local_1a0);
    cfd::core::Script::Script(&script,(string *)&addr);
    std::__cxx11::string::~string((string *)&addr);
    cfd::core::Address::Address(&addr);
    if (is_bitcoin == true) {
      cfd::AddressFactory::AddressFactory(&address_factory,type);
      cfd::AddressFactory::GetAddressByLockingScript(&local_1a0,&address_factory,&script);
      cfd::core::Address::operator=(&addr,&local_1a0);
    }
    else {
      cfd::ElementsAddressFactory::ElementsAddressFactory
                ((ElementsAddressFactory *)&address_factory,type);
      cfd::AddressFactory::GetAddressByLockingScript(&local_1a0,&address_factory,&script);
      cfd::core::Address::operator=(&addr,&local_1a0);
    }
    cfd::core::Address::~Address(&local_1a0);
    cfd::AddressFactory::~AddressFactory(&address_factory);
    cfd::core::Address::GetAddress_abi_cxx11_((string *)&local_1a0,&addr);
    pcVar2 = cfd::capi::CreateString((string *)&local_1a0);
    *address = pcVar2;
    std::__cxx11::string::~string((string *)&local_1a0);
    cfd::core::Address::~Address(&addr);
    cfd::core::Script::~Script(&script);
    return 0;
  }
  addr._0_8_ = (long)
               "//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_address.cpp"
               + 0x56;
  addr.witness_ver_ = 0x409;
  addr.address_._M_dataplus._M_p = "CfdGetAddressFromLockingScript";
  cfd::core::logger::warn<>((CfdSourceLocation *)&addr,"address is null.");
  pCVar3 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string
            ((string *)&addr,"Failed to parameter. address is null.",(allocator *)&local_1a0);
  cfd::core::CfdException::CfdException(pCVar3,kCfdIllegalArgumentError,(string *)&addr);
  __cxa_throw(pCVar3,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetAddressFromLockingScript(
    void* handle, const char* locking_script, int network_type,
    char** address) {
  int error_code = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(locking_script)) {
      warn(CFD_LOG_SOURCE, "lockingScript is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. lockingScript is null or empty.");
    }
    if (address == nullptr) {
      warn(CFD_LOG_SOURCE, "address is null.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. address is null.");
    }

    bool is_bitcoin = false;
    NetType net_type = cfd::capi::ConvertNetType(network_type, &is_bitcoin);
    Script script = Script(locking_script);
    Address addr;

    if (is_bitcoin) {
      AddressFactory address_factory(net_type);
      addr = address_factory.GetAddressByLockingScript(script);
    } else {
#ifndef CFD_DISABLE_ELEMENTS
      ElementsAddressFactory elements_factory(net_type);
      addr = elements_factory.GetAddressByLockingScript(script);
#else
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Elements not supported.");
#endif  // CFD_DISABLE_ELEMENTS
    }
    *address = CreateString(addr.GetAddress());
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    error_code = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return error_code;
}